

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spfgmr.c
# Opt level: O3

int SUNLinSolFree_SPFGMR(SUNLinearSolver S)

{
  void *pvVar1;
  int iVar2;
  int *__ptr;
  long lVar3;
  
  if (S != (SUNLinearSolver)0x0) {
    __ptr = (int *)S->content;
    if (*(N_Vector *)(__ptr + 0x20) != (N_Vector)0x0) {
      N_VDestroy(*(N_Vector *)(__ptr + 0x20));
      __ptr = (int *)S->content;
    }
    if (*(N_Vector *)(__ptr + 0x24) != (N_Vector)0x0) {
      N_VDestroy(*(N_Vector *)(__ptr + 0x24));
      __ptr = (int *)S->content;
    }
    if (*(N_Vector **)(__ptr + 0x18) != (N_Vector *)0x0) {
      N_VDestroyVectorArray(*(N_Vector **)(__ptr + 0x18),*__ptr + 1);
      __ptr = (int *)S->content;
    }
    if (*(N_Vector **)(__ptr + 0x1a) != (N_Vector *)0x0) {
      N_VDestroyVectorArray(*(N_Vector **)(__ptr + 0x1a),*__ptr + 1);
      __ptr = (int *)S->content;
    }
    pvVar1 = *(void **)(__ptr + 0x1c);
    if (pvVar1 != (void *)0x0) {
      iVar2 = *__ptr;
      if (-1 < iVar2) {
        lVar3 = -1;
        do {
          pvVar1 = *(void **)(*(long *)(__ptr + 0x1c) + 8 + lVar3 * 8);
          if (pvVar1 != (void *)0x0) {
            free(pvVar1);
            __ptr = (int *)S->content;
            iVar2 = *__ptr;
          }
          lVar3 = lVar3 + 1;
        } while (lVar3 < iVar2);
        pvVar1 = *(void **)(__ptr + 0x1c);
      }
      free(pvVar1);
      __ptr = (int *)S->content;
    }
    if (*(void **)(__ptr + 0x1e) != (void *)0x0) {
      free(*(void **)(__ptr + 0x1e));
      __ptr = (int *)S->content;
    }
    if (*(void **)(__ptr + 0x22) != (void *)0x0) {
      free(*(void **)(__ptr + 0x22));
      __ptr = (int *)S->content;
    }
    if (*(void **)(__ptr + 0x26) != (void *)0x0) {
      free(*(void **)(__ptr + 0x26));
      __ptr = (int *)S->content;
    }
    if (*(void **)(__ptr + 0x28) != (void *)0x0) {
      free(*(void **)(__ptr + 0x28));
      __ptr = (int *)S->content;
    }
    free(__ptr);
    S->content = (void *)0x0;
    free(S->ops);
    free(S);
  }
  return 0;
}

Assistant:

int SUNLinSolFree_SPFGMR(SUNLinearSolver S)
{
  int k;

  if (S == NULL) return(SUNLS_SUCCESS);

  /* delete items from within the content structure */
  if (SPFGMR_CONTENT(S)->xcor)
    N_VDestroy(SPFGMR_CONTENT(S)->xcor);
  if (SPFGMR_CONTENT(S)->vtemp)
    N_VDestroy(SPFGMR_CONTENT(S)->vtemp);
  if (SPFGMR_CONTENT(S)->V)
    N_VDestroyVectorArray(SPFGMR_CONTENT(S)->V,
                          SPFGMR_CONTENT(S)->maxl+1);
  if (SPFGMR_CONTENT(S)->Z)
    N_VDestroyVectorArray(SPFGMR_CONTENT(S)->Z,
                          SPFGMR_CONTENT(S)->maxl+1);
  if (SPFGMR_CONTENT(S)->Hes) {
    for (k=0; k<=SPFGMR_CONTENT(S)->maxl; k++)
      if (SPFGMR_CONTENT(S)->Hes[k])
        free(SPFGMR_CONTENT(S)->Hes[k]);
    free(SPFGMR_CONTENT(S)->Hes);
  }
  if (SPFGMR_CONTENT(S)->givens)
    free(SPFGMR_CONTENT(S)->givens);
  if (SPFGMR_CONTENT(S)->yg)
    free(SPFGMR_CONTENT(S)->yg);
  if (SPFGMR_CONTENT(S)->cv)
    free(SPFGMR_CONTENT(S)->cv);
  if (SPFGMR_CONTENT(S)->Xv)
    free(SPFGMR_CONTENT(S)->Xv);

  /* delete generic structures */
  free(S->content);  S->content = NULL;
  free(S->ops);  S->ops = NULL;
  free(S); S = NULL;
  return(SUNLS_SUCCESS);
}